

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  size_type sVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  ulong uVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  char cVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  pointer local_130;
  _Base_ptr local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  if ((_Rb_tree_header *)cVar4._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&arg);
  }
  else {
    format.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    format.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    format.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (g->_M_string_length != 0) {
      std::operator+(&local_120," ",g);
      std::operator+(&local_150,&local_120," options:\n");
      arg._M_dataplus._M_p = (pointer)&arg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == &local_150.field_2) {
        arg.field_2._8_8_ = local_150.field_2._8_8_;
      }
      else {
        arg._M_dataplus._M_p = local_150._M_dataplus._M_p;
      }
      arg.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
      arg._M_string_length = local_150._M_string_length;
      local_150._M_string_length = 0;
      local_150.field_2._M_allocated_capacity =
           local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_120);
    }
    local_130 = (pointer)cVar4._M_node[4]._M_parent;
    uVar7 = 0;
    local_128 = cVar4._M_node;
    for (__rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(cVar4._M_node + 4) + 0x90); (pointer)&__rhs[-5].field_2 != local_130;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&__rhs[6].field_2 + 8)) {
      if (*(char *)&__rhs[2]._M_dataplus._M_p == '\x01') {
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->m_positional_set)._M_h,(key_type *)&__rhs[-4].field_2);
        if (cVar5.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00129bfd;
      }
      else {
LAB_00129bfd:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s,"  ",(allocator<char> *)&arg);
        if (*(long *)((long)&__rhs[-5].field_2 + 8) == 0) {
          std::__cxx11::string::append((char *)&s);
        }
        else {
          std::operator+(&local_150,"-",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__rhs[-5].field_2);
          std::operator+(&arg,&local_150,",");
          std::__cxx11::string::append((string *)&s);
          std::__cxx11::string::~string((string *)&arg);
          std::__cxx11::string::~string((string *)&local_150);
        }
        if (*(long *)((long)&__rhs[-4].field_2 + 8) != 0) {
          std::operator+(&arg," --",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__rhs[-4].field_2);
          std::__cxx11::string::append((string *)&s);
          std::__cxx11::string::~string((string *)&arg);
        }
        if (__rhs[-2].field_2._M_local_buf[0] == '\x01') {
          if (__rhs[1]._M_string_length == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&arg,"arg",(allocator<char> *)&local_150);
          }
          else {
            std::__cxx11::string::string((string *)&arg,(string *)(__rhs + 1));
          }
          if (__rhs[-1].field_2._M_local_buf[8] == '\x01') {
            std::operator+(&d," [=",&arg);
            std::operator+(&local_50,&d,"(=");
            std::operator+(&local_120,&local_50,__rhs);
            std::operator+(&local_150,&local_120,")]");
            std::__cxx11::string::append((string *)&s);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_50);
            this_00 = &d;
          }
          else {
            std::operator+(&local_150," ",&arg);
            std::__cxx11::string::append((string *)&s);
            this_00 = &local_150;
          }
          std::__cxx11::string::~string((string *)this_00);
          std::__cxx11::string::~string((string *)&arg);
        }
        sVar3 = s._M_string_length;
        if (s._M_string_length < uVar7) {
          sVar3 = uVar7;
        }
        uVar7 = sVar3;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        local_150._M_string_length = 0;
        local_150.field_2._M_allocated_capacity =
             local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&arg,&s,&local_150);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&format,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&arg);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&arg);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&s);
      }
    }
    uVar6 = 0x1e;
    if (uVar7 < 0x1e) {
      uVar6 = uVar7;
    }
    local_130 = format.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = local_128[4]._M_parent;
    cVar9 = (char)uVar6 + '\x02';
    for (p_Var8 = *(_Base_ptr *)(local_128 + 4); p_Var8 != p_Var2;
        p_Var8 = (_Base_ptr)&p_Var8[6]._M_right) {
      if (*(char *)&p_Var8[6]._M_left == '\x01') {
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->m_positional_set)._M_h,(key_type *)(p_Var8 + 1));
        if (cVar5.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00129eac;
      }
      else {
LAB_00129eac:
        std::__cxx11::string::string((string *)&arg,(string *)(p_Var8 + 2));
        local_128 = p_Var8;
        if (*(byte *)((long)&p_Var8[3]._M_color + 1) == 1) {
          std::operator+(&local_50," (default: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p_Var8[3]._M_parent);
          std::operator+(&local_120,&local_50,")");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p == &local_120.field_2) {
            local_150.field_2._8_8_ = local_120.field_2._8_8_;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          }
          else {
            local_150._M_dataplus._M_p = local_120._M_dataplus._M_p;
          }
          local_150.field_2._M_allocated_capacity._1_7_ =
               local_120.field_2._M_allocated_capacity._1_7_;
          local_150.field_2._M_local_buf[0] = local_120.field_2._M_local_buf[0];
          local_150._M_string_length = local_120._M_string_length;
          local_120._M_string_length = 0;
          local_120.field_2._M_local_buf[0] = '\0';
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::append((string *)&arg);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_50);
        }
        d._M_dataplus._M_p = (pointer)&d.field_2;
        d._M_string_length = 0;
        d.field_2._M_local_buf[0] = '\0';
        uVar7 = 0;
        __last._M_current = arg._M_dataplus._M_p;
        __first._M_current = arg._M_dataplus._M_p;
        for (__last_00._M_current = arg._M_dataplus._M_p;
            __last_00._M_current != arg._M_dataplus._M_p + arg._M_string_length;
            __last_00._M_current = __last_00._M_current + 1) {
          if (*__last_00._M_current == ' ') {
            __last._M_current = __last_00._M_current;
          }
          if (0x4a - uVar6 < uVar7) {
            if (__last._M_current == __first._M_current) {
              __last._M_current = __last_00._M_current + 1;
              std::__cxx11::string::
              append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                        ((string *)&d,__first,__last);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_150,"\n",(allocator<char> *)&local_50);
              std::__cxx11::string::append((string *)&d);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::append((ulong)&d,cVar9);
              __first._M_current = __last._M_current;
            }
            else {
              std::__cxx11::string::
              append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                        ((string *)&d,__first,__last);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"\n",(allocator<char> *)&local_50);
              std::__cxx11::string::append((string *)&d);
              std::__cxx11::string::~string((string *)&local_120);
              std::__cxx11::string::append((ulong)&d,cVar9);
              __first._M_current = __last._M_current + 1;
            }
            uVar7 = 0;
          }
          else {
            uVar7 = uVar7 + 1;
          }
        }
        std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)&d,__first,__last_00);
        std::__cxx11::string::~string((string *)&arg);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        paVar1 = &local_150.field_2;
        uVar7 = (local_130->first)._M_string_length;
        if (uVar6 < uVar7) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          local_150._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct((ulong)&local_150,cVar9);
          arg._M_dataplus._M_p = (pointer)&arg.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p == paVar1) {
            arg.field_2._8_8_ = local_150.field_2._8_8_;
          }
          else {
            arg._M_dataplus._M_p = local_150._M_dataplus._M_p;
          }
          arg.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
          arg._M_string_length = local_150._M_string_length;
          local_150._M_string_length = 0;
          local_150.field_2._M_allocated_capacity =
               local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_150._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          local_150._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct((ulong)&local_150,cVar9 - (char)uVar7);
          arg._M_dataplus._M_p = (pointer)&arg.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p == paVar1) {
            arg.field_2._8_8_ = local_150.field_2._8_8_;
          }
          else {
            arg._M_dataplus._M_p = local_150._M_dataplus._M_p;
          }
          arg.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
          arg._M_string_length = local_150._M_string_length;
          local_150._M_string_length = 0;
          local_150.field_2._M_allocated_capacity =
               local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_150._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)&arg);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        local_130 = local_130 + 1;
        std::__cxx11::string::~string((string *)&d);
        p_Var8 = local_128;
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&format);
  }
  return __return_storage_ptr__;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n");
  }

  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += '\n';
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += '\n';

    ++fiter;
  }

  return result;
}